

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JtagAnalyzerSettings.cpp
# Opt level: O1

char * __thiscall JtagAnalyzerSettings::SaveSettings(JtagAnalyzerSettings *this)

{
  char *pcVar1;
  SimpleArchive text_archive;
  SimpleArchive aSStack_18 [8];
  
  SimpleArchive::SimpleArchive(aSStack_18);
  SimpleArchive::operator<<(aSStack_18,&this->mTmsChannel);
  SimpleArchive::operator<<(aSStack_18,&this->mTckChannel);
  SimpleArchive::operator<<(aSStack_18,&this->mTdiChannel);
  SimpleArchive::operator<<(aSStack_18,&this->mTdoChannel);
  SimpleArchive::operator<<(aSStack_18,&this->mTrstChannel);
  SimpleArchive::operator<<(aSStack_18,this->mTAPInitialState);
  SimpleArchive::operator<<(aSStack_18,this->mInstructRegBitOrder);
  SimpleArchive::operator<<(aSStack_18,this->mDataRegBitOrder);
  SimpleArchive::operator<<(aSStack_18,this->mShiftDRBitsPerDataUnit);
  SimpleArchive::operator<<(aSStack_18,this->mShowBitCount);
  SimpleArchive::GetString();
  pcVar1 = (char *)AnalyzerSettings::SetReturnString((char *)this);
  SimpleArchive::~SimpleArchive(aSStack_18);
  return pcVar1;
}

Assistant:

const char* JtagAnalyzerSettings::SaveSettings()
{
    SimpleArchive text_archive;

    text_archive << mTmsChannel;
    text_archive << mTckChannel;
    text_archive << mTdiChannel;
    text_archive << mTdoChannel;
    text_archive << mTrstChannel;
    text_archive << int( mTAPInitialState );
    text_archive << int( mInstructRegBitOrder );
    text_archive << int( mDataRegBitOrder );
    text_archive << mShiftDRBitsPerDataUnit;

    text_archive << mShowBitCount; // added after 1.2.3

    return SetReturnString( text_archive.GetString() );
}